

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::argument_loader<PairedReadsMapper_const*,long,bool,bool>::
load_impl_sequence<0ul,1ul,2ul,3ul>(void *param_1,long param_2)

{
  reference pvVar1;
  initializer_list<bool> *this;
  __tuple_element_t<3UL,_tuple<type_caster<PairedReadsMapper,_void>,_type_caster<long,_void>,_type_caster<bool>,_type_caster<bool>_>_>
  *__n;
  const_iterator pbVar2;
  bool r;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<bool> *__range3;
  undefined8 in_stack_ffffffffffffff30;
  undefined1 uVar3;
  type_caster_generic *in_stack_ffffffffffffff38;
  size_type in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  handle in_stack_ffffffffffffff58;
  const_iterator local_a0;
  reference local_98;
  undefined8 in_stack_ffffffffffffff78;
  undefined1 convert;
  _Bit_reference in_stack_ffffffffffffff80;
  reference local_68;
  PyObject *local_58;
  reference local_50;
  PyObject *local_40;
  bool local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  initializer_list<bool> local_30;
  initializer_list<bool> *local_20;
  long local_18;
  void *local_10;
  
  convert = (undefined1)((ulong)in_stack_ffffffffffffff78 >> 0x38);
  uVar3 = (undefined1)((ulong)in_stack_ffffffffffffff30 >> 0x38);
  local_18 = param_2;
  local_10 = param_1;
  std::
  get<0ul,pybind11::detail::type_caster<PairedReadsMapper,void>,pybind11::detail::type_caster<long,void>,pybind11::detail::type_caster<bool,void>,pybind11::detail::type_caster<bool,void>>
            ((tuple<pybind11::detail::type_caster<PairedReadsMapper,_void>,_pybind11::detail::type_caster<long,_void>,_pybind11::detail::type_caster<bool,_void>,_pybind11::detail::type_caster<bool,_void>_>
              *)0x406e99);
  pvVar1 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),
                      0);
  local_40 = pvVar1->m_ptr;
  local_50 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)
                        CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                        in_stack_ffffffffffffff48);
  std::_Bit_reference::operator_cast_to_bool(&local_50);
  local_34 = type_caster_generic::load(in_stack_ffffffffffffff38,(handle)param_1,(bool)uVar3);
  this = (initializer_list<bool> *)
         std::
         get<1ul,pybind11::detail::type_caster<PairedReadsMapper,void>,pybind11::detail::type_caster<long,void>,pybind11::detail::type_caster<bool,void>,pybind11::detail::type_caster<bool,void>>
                   ((tuple<pybind11::detail::type_caster<PairedReadsMapper,_void>,_pybind11::detail::type_caster<long,_void>,_pybind11::detail::type_caster<bool,_void>,_pybind11::detail::type_caster<bool,_void>_>
                     *)0x406f19);
  pvVar1 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),
                      1);
  local_58 = pvVar1->m_ptr;
  local_68 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)
                        CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                        in_stack_ffffffffffffff48);
  std::_Bit_reference::operator_cast_to_bool(&local_68);
  local_33 = type_caster<long,_void>::load
                       ((type_caster<long,_void> *)in_stack_ffffffffffffff80._M_p,
                        (PyObject *)in_stack_ffffffffffffff80._M_mask,(bool)convert);
  std::
  get<2ul,pybind11::detail::type_caster<PairedReadsMapper,void>,pybind11::detail::type_caster<long,void>,pybind11::detail::type_caster<bool,void>,pybind11::detail::type_caster<bool,void>>
            ((tuple<pybind11::detail::type_caster<PairedReadsMapper,_void>,_pybind11::detail::type_caster<long,_void>,_pybind11::detail::type_caster<bool,_void>,_pybind11::detail::type_caster<bool,_void>_>
              *)0x406f94);
  std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
            ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),2);
  std::vector<bool,_std::allocator<bool>_>::operator[]
            ((vector<bool,_std::allocator<bool>_> *)
             CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48
            );
  uVar3 = (undefined1)(in_stack_ffffffffffffff48 >> 0x38);
  std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xffffffffffffff80);
  local_32 = type_caster<bool,_void>::load
                       ((type_caster<bool,_void> *)
                        CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                        in_stack_ffffffffffffff58,(bool)uVar3);
  __n = std::
        get<3ul,pybind11::detail::type_caster<PairedReadsMapper,void>,pybind11::detail::type_caster<long,void>,pybind11::detail::type_caster<bool,void>,pybind11::detail::type_caster<bool,void>>
                  ((tuple<pybind11::detail::type_caster<PairedReadsMapper,_void>,_pybind11::detail::type_caster<long,_void>,_pybind11::detail::type_caster<bool,_void>,_pybind11::detail::type_caster<bool,_void>_>
                    *)0x407009);
  std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
            ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),3);
  local_98 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)
                        CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),(size_type)__n
                       );
  uVar3 = (undefined1)((ulong)__n >> 0x38);
  std::_Bit_reference::operator_cast_to_bool(&local_98);
  local_31 = type_caster<bool,_void>::load
                       ((type_caster<bool,_void> *)
                        CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                        in_stack_ffffffffffffff58,(bool)uVar3);
  local_30._M_array = &local_34;
  local_30._M_len = 4;
  local_20 = &local_30;
  local_a0 = std::initializer_list<bool>::begin(local_20);
  pbVar2 = std::initializer_list<bool>::end(this);
  while( true ) {
    if (local_a0 == pbVar2) {
      return true;
    }
    if ((*local_a0 & 1U) == 0) break;
    local_a0 = local_a0 + 1;
  }
  return false;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }